

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall
Annotator_automaticIdAllItemsAllDuplicated_Test::TestBody
          (Annotator_automaticIdAllItemsAllDuplicated_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string sVar2;
  element_type *peVar3;
  char cVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_24;
  ModelPtr model;
  VariablePairPtr connection2;
  AnnotatorPtr annotator;
  ComponentPtr itemComponent;
  ImportSourcePtr itemImportSource;
  ComponentPtr itemComponentEncapsulation;
  ModelPtr itemEncapsulation;
  VariablePairPtr mapping;
  VariablePairPtr mapping2;
  ModelPtr itemModel;
  VariablePairPtr connection;
  VariablePtr itemVariable;
  UnitsPtr itemUnits;
  ResetPtr itemTestValue;
  ResetPtr itemResetValue;
  ResetPtr itemReset;
  ParserPtr parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  shared_ptr<libcellml::Model> local_1f8;
  long local_1e8 [2];
  long *local_1d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_1d0;
  long local_1c8 [2];
  shared_ptr<libcellml::Model> local_1b8;
  long *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1a0;
  long local_198 [2];
  string local_188 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  shared_ptr *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  long *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  string local_158 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  long *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  element_type *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  string local_128 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  shared_ptr local_118 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  string local_f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  string local_e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  shared_ptr local_d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  string local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  string local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  long *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  long *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  long *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  long *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  long *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  shared_ptr local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined1 local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  libcellml::Parser::create(SUB81(local_38,0));
  libcellml::Parser::parseModel((string *)&local_1b8);
  libcellml::Annotator::create();
  peVar3 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"component2","");
  libcellml::ComponentEntity::component((string *)&local_168,SUB81(peVar3,0));
  local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"variable1","");
  libcellml::Component::variable(local_128);
  peVar3 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"component2","");
  libcellml::ComponentEntity::component(local_158,SUB81(peVar3,0));
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"variable1","");
  libcellml::Component::variable((string *)&local_138);
  libcellml::Variable::equivalentVariable((ulong)&local_148);
  libcellml::VariablePair::create(local_d8,(shared_ptr *)local_128);
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140);
  }
  if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_1e8) {
    operator_delete(local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_1e8[0] + 1);
  }
  if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  peVar3 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"component2","");
  libcellml::ComponentEntity::component((string *)&local_148,SUB81(peVar3,0));
  local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"variable2","");
  libcellml::Component::variable((string *)&local_168);
  peVar3 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"component2","");
  libcellml::ComponentEntity::component((string *)&local_108,SUB81(peVar3,0));
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"variable2","");
  libcellml::Component::variable(local_158);
  libcellml::Variable::equivalentVariable((ulong)&local_138);
  libcellml::VariablePair::create((shared_ptr *)local_128,(shared_ptr *)&local_168);
  if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_1e8) {
    operator_delete(local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_1e8[0] + 1);
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  libcellml::ComponentEntity::component((ulong)&local_168);
  peVar3 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"component2","");
  libcellml::ComponentEntity::component((string *)&local_148,SUB81(peVar3,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  peVar3 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_138 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_130 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
  if (local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 8) =
           *(int *)(local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 8) =
           *(int *)(local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) + 1;
    }
  }
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"component1","");
  libcellml::ComponentEntity::component((string *)&local_1f8,SUB81(peVar3,0));
  libcellml::ImportedEntity::importSource();
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  peVar3 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_108 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_100 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
  if (local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 8) =
           *(int *)(local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 8) =
           *(int *)(local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) + 1;
    }
  }
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"component2","");
  libcellml::ComponentEntity::component((string *)&local_1f8,SUB81(peVar3,0));
  libcellml::Component::reset((ulong)&local_68);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"component2","");
  libcellml::ComponentEntity::component((string *)&local_1f8,(bool)sVar2);
  libcellml::Component::reset((ulong)&local_78);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"component2","");
  libcellml::ComponentEntity::component((string *)&local_1f8,(bool)sVar2);
  libcellml::Component::reset((ulong)&local_88);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  libcellml::Model::units((ulong)&local_218);
  libcellml::UnitsItem::create(local_58,(ulong)&local_218);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length);
  }
  libcellml::Model::units((ulong)&local_98);
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"component2","");
  libcellml::ComponentEntity::component((string *)&local_1f8,(bool)sVar2);
  libcellml::Component::variable((ulong)&local_a8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  libcellml::Annotator::setModel(local_178);
  local_1d8 = local_168;
  sStack_1d0.ptr_ = local_160;
  if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_160->_M_string_length = (int)local_160->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_160->_M_string_length = (int)local_160->_M_string_length + 1;
    }
  }
  owningModel((shared_ptr *)&local_1f8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)&local_218,"model","owningModel(itemComponent)",&local_1b8,&local_1f8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if ((char)local_218._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_218._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x54d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_1f8.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8 = local_148;
  sStack_1d0.ptr_ = local_140;
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_140->_M_string_length = (int)local_140->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_140->_M_string_length = (int)local_140->_M_string_length + 1;
    }
  }
  owningModel((shared_ptr *)&local_1f8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)&local_218,"model","owningModel(itemComponentEncapsulation)",&local_1b8,
             &local_1f8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if ((char)local_218._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_218._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x54e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_1f8.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::VariablePair::variable1();
  local_1d8 = local_1a8;
  sStack_1d0.ptr_ = pbStack_1a0;
  local_1a8 = (long *)0x0;
  pbStack_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  owningModel((shared_ptr *)&local_1f8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)&local_218,"model","owningModel(itemConnection->variable1())",&local_1b8,
             &local_1f8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if ((char)local_218._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_218._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x54f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_1f8.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::VariablePair::variable1();
  local_1d8 = local_1a8;
  sStack_1d0.ptr_ = pbStack_1a0;
  local_1a8 = (long *)0x0;
  pbStack_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  owningModel((shared_ptr *)&local_1f8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)&local_218,"model","owningModel(itemMapVariables->variable1())",&local_1b8,
             &local_1f8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if ((char)local_218._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_218._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x550,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_1f8.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8 = local_68;
  sStack_1d0.ptr_ = local_60;
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_60->_M_string_length = (int)local_60->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_60->_M_string_length = (int)local_60->_M_string_length + 1;
    }
  }
  owningModel((shared_ptr *)&local_1f8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)&local_218,"model","owningModel(itemReset)",&local_1b8,&local_1f8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if ((char)local_218._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_218._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x551,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_1f8.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8 = local_78;
  sStack_1d0.ptr_ = local_70;
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_70->_M_string_length = (int)local_70->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_70->_M_string_length = (int)local_70->_M_string_length + 1;
    }
  }
  owningModel((shared_ptr *)&local_1f8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)&local_218,"model","owningModel(itemResetValue)",&local_1b8,&local_1f8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if ((char)local_218._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_218._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x552,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_1f8.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8 = local_88;
  sStack_1d0.ptr_ = local_80;
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_80->_M_string_length = (int)local_80->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_80->_M_string_length = (int)local_80->_M_string_length + 1;
    }
  }
  owningModel((shared_ptr *)&local_1f8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)&local_218,"model","owningModel(itemTestValue)",&local_1b8,&local_1f8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if ((char)local_218._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_218._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x553,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_1f8.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::UnitsItem::units();
  local_1d8 = local_1a8;
  sStack_1d0.ptr_ = pbStack_1a0;
  local_1a8 = (long *)0x0;
  pbStack_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  owningModel((shared_ptr *)&local_1f8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)&local_218,"model","owningModel(itemUnitsItem->units())",&local_1b8,
             &local_1f8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if ((char)local_218._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_218._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x554,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_1f8.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8 = local_98;
  sStack_1d0.ptr_ = local_90;
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_90->_M_string_length = (int)local_90->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_90->_M_string_length = (int)local_90->_M_string_length + 1;
    }
  }
  owningModel((shared_ptr *)&local_1f8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)&local_218,"model","owningModel(itemUnits)",&local_1b8,&local_1f8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if ((char)local_218._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_218._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x555,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_1f8.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8 = local_a8;
  sStack_1d0.ptr_ = local_a0;
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_a0->_M_string_length = (int)local_a0->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_a0->_M_string_length = (int)local_a0->_M_string_length + 1;
    }
  }
  owningModel((shared_ptr *)&local_1f8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)&local_218,"model","owningModel(itemVariable)",&local_1b8,&local_1f8);
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if ((char)local_218._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)(undefined1 *)local_218._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x556,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_1f8.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_218._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da55\"","annotator->assignId(itemComponent)",
             (char (*) [7])"b4da55",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x559,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da56\"",
             "annotator->assignId(itemComponentEncapsulation, libcellml::CellmlElementType::COMPONENT_REF)"
             ,(char (*) [7])"b4da56",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da57\"",
             "annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [7])"b4da57",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da58\"","annotator->assignId(itemImportSource)",
             (char (*) [7])"b4da58",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da59\"","annotator->assignId(itemMapVariables)",
             (char (*) [7])"b4da59",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da5a\"","annotator->assignId(itemModel)",
             (char (*) [7])"b4da5a",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da5b\"","annotator->assignId(itemReset)",
             (char (*) [7])"b4da5b",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da5c\"",
             "annotator->assignId(itemResetValue, libcellml::CellmlElementType::RESET_VALUE)",
             (char (*) [7])"b4da5c",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x560,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da5d\"",
             "annotator->assignId(itemTestValue, libcellml::CellmlElementType::TEST_VALUE)",
             (char (*) [7])"b4da5d",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x561,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da5e\"","annotator->assignId(itemUnitsItem)",
             (char (*) [7])"b4da5e",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x562,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da5f\"","annotator->assignId(itemUnits)",
             (char (*) [7])"b4da5f",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x563,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da60\"","annotator->assignId(itemVariable)",
             (char (*) [7])"b4da60",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x564,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da61\"",
             "annotator->assignId(itemEncapsulation, libcellml::CellmlElementType::ENCAPSULATION)",
             (char (*) [7])"b4da61",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x565,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ComponentEntity::component((ulong)&local_1d8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da55\"","model->component(0)->id()",(char (*) [7])"b4da55",
             &local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x567,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"component2","");
  libcellml::ComponentEntity::component((string *)&local_1a8,(bool)sVar2);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1d8,"\"b4da56\"",
             "model->component(\"component2\")->encapsulationId()",(char (*) [7])"b4da56",&local_218
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_1e8) {
    operator_delete(local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_1e8[0] + 1);
  }
  if (local_1d8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (sStack_1d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_1d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x568,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::VariablePair::variable1();
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_218,(shared_ptr *)&local_1d8);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da57\"",
             "libcellml::Variable::equivalenceConnectionId(connection->variable1(), connection->variable2())"
             ,(char (*) [7])"b4da57",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x569,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"component1","");
  libcellml::ComponentEntity::component(local_188,(bool)sVar2);
  libcellml::ImportedEntity::importSource();
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1d8,"\"b4da58\"",
             "model->component(\"component1\")->importSource()->id()",(char (*) [7])"b4da58",
             &local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_1e8) {
    operator_delete(local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_1e8[0] + 1);
  }
  if (local_1d8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (sStack_1d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_1d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::VariablePair::variable1();
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_218,(shared_ptr *)&local_1d8);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da59\"",
             "libcellml::Variable::equivalenceMappingId(mapping->variable1(), mapping->variable2())"
             ,(char (*) [7])"b4da59",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da5a\"","model->id()",(char (*) [7])"b4da5a",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"component2","");
  libcellml::ComponentEntity::component(local_188,(bool)sVar2);
  libcellml::Component::reset((ulong)&local_1a8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1d8,"\"b4da5b\"","model->component(\"component2\")->reset(0)->id()",
             (char (*) [7])"b4da5b",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_1e8) {
    operator_delete(local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_1e8[0] + 1);
  }
  if (local_1d8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (sStack_1d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_1d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"component2","");
  libcellml::ComponentEntity::component(local_188,(bool)sVar2);
  libcellml::Component::reset((ulong)&local_1a8);
  libcellml::Reset::resetValueId_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1d8,"\"b4da5c\"",
             "model->component(\"component2\")->reset(0)->resetValueId()",(char (*) [7])"b4da5c",
             &local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_1e8) {
    operator_delete(local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_1e8[0] + 1);
  }
  if (local_1d8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (sStack_1d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_1d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"component2","");
  libcellml::ComponentEntity::component(local_188,(bool)sVar2);
  libcellml::Component::reset((ulong)&local_1a8);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1d8,"\"b4da5d\"",
             "model->component(\"component2\")->reset(0)->testValueId()",(char (*) [7])"b4da5d",
             &local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_1e8) {
    operator_delete(local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_1e8[0] + 1);
  }
  if (local_1d8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (sStack_1d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_1d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Model::units((ulong)&local_1d8);
  libcellml::Units::unitId_abi_cxx11_((ulong)&local_218);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da5e\"","model->units(1)->unitId(0)",(char (*) [7])"b4da5e"
             ,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x570,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Model::units((ulong)&local_1d8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da5f\"","model->units(1)->id()",(char (*) [7])"b4da5f",
             &local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x571,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"component2","");
  libcellml::ComponentEntity::component(local_188,(bool)sVar2);
  libcellml::Component::variable((ulong)&local_1a8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1d8,"\"b4da60\"",
             "model->component(\"component2\")->variable(0)->id()",(char (*) [7])"b4da60",&local_218
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_1e8) {
    operator_delete(local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_1e8[0] + 1);
  }
  if (local_1d8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (sStack_1d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_1d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x572,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da61\"","model->encapsulationId()",(char (*) [7])"b4da61",
             &local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x573,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"component2","");
  libcellml::ComponentEntity::component(local_f8,(bool)sVar2);
  local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"variable1","");
  libcellml::Component::variable(local_e8);
  libcellml::Variable::equivalentVariable((ulong)local_118);
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"component2","");
  libcellml::ComponentEntity::component(local_c8,(bool)sVar2);
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"variable1","");
  libcellml::Component::variable(local_b8);
  libcellml::VariablePair::create((shared_ptr *)local_188,local_118);
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_1e8) {
    operator_delete(local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_1e8[0] + 1);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  sVar2 = local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"component4","");
  libcellml::ComponentEntity::component(local_b8,(bool)sVar2);
  local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"variable2","");
  libcellml::Component::variable(local_f8);
  libcellml::Variable::equivalentVariable((ulong)local_e8);
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"component4","");
  libcellml::ComponentEntity::component
            (local_48,(bool)local_1b8.
                            super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                            _0_1_);
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"variable2","");
  libcellml::Component::variable(local_c8);
  libcellml::VariablePair::create(local_118,(shared_ptr *)local_e8);
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_1e8) {
    operator_delete(local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_1e8[0] + 1);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da62\"",
             "annotator->assignId(itemConnection2, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [7])"b4da62",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x57f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::VariablePair::variable1();
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_218,(shared_ptr *)&local_1d8);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da62\"",
             "libcellml::Variable::equivalenceConnectionId(connection2->variable1(), connection2->variable2())"
             ,(char (*) [7])"b4da62",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x580,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_218,(CellmlElementType)local_178);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da63\"","annotator->assignId(itemMapVariables2)",
             (char (*) [7])"b4da63",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x582,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::VariablePair::variable1();
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_218,(shared_ptr *)&local_1d8);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_1f8,"\"b4da63\"",
             "libcellml::Variable::equivalenceMappingId(mapping2->variable1(), mapping2->variable2())"
             ,(char (*) [7])"b4da63",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (pbStack_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_1a0);
  }
  if (sStack_1d0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_1d0.ptr_);
  }
  if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x583,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar4 = testing::internal::IsTrue(true);
      if ((cVar4 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_218._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0);
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80);
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70);
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60);
  }
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140);
  }
  if (local_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160);
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
  }
  if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
  }
  if (local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

TEST(Annotator, automaticIdAllItemsAllDuplicated)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringDuplicateIds);
    auto annotator = libcellml::Annotator::create();

    auto connection = libcellml::VariablePair::create(
        model->component("component2")->variable("variable1"),
        model->component("component2")->variable("variable1")->equivalentVariable(0));
    auto mapping = libcellml::VariablePair::create(
        model->component("component2")->variable("variable2"),
        model->component("component2")->variable("variable2")->equivalentVariable(0));

    auto itemComponent = model->component(0);
    auto itemComponentEncapsulation = model->component("component2");
    auto const &itemConnection = connection;
    auto itemEncapsulation = model;
    auto itemImportSource = model->component("component1")->importSource();
    auto const &itemMapVariables = mapping;
    auto itemModel = model;
    auto itemReset = model->component("component2")->reset(0);
    auto itemResetValue = model->component("component2")->reset(0);
    auto itemTestValue = model->component("component2")->reset(0);
    auto const &itemUnitsItem = libcellml::UnitsItem::create(model->units(1), 0);
    auto itemUnits = model->units(1);
    auto itemVariable = model->component("component2")->variable(0);

    annotator->setModel(model);

    EXPECT_EQ(model, owningModel(itemComponent));
    EXPECT_EQ(model, owningModel(itemComponentEncapsulation));
    EXPECT_EQ(model, owningModel(itemConnection->variable1()));
    EXPECT_EQ(model, owningModel(itemMapVariables->variable1()));
    EXPECT_EQ(model, owningModel(itemReset));
    EXPECT_EQ(model, owningModel(itemResetValue));
    EXPECT_EQ(model, owningModel(itemTestValue));
    EXPECT_EQ(model, owningModel(itemUnitsItem->units()));
    EXPECT_EQ(model, owningModel(itemUnits));
    EXPECT_EQ(model, owningModel(itemVariable));

    // Expect each have had a change of identifier.
    EXPECT_EQ("b4da55", annotator->assignId(itemComponent));
    EXPECT_EQ("b4da56", annotator->assignId(itemComponentEncapsulation, libcellml::CellmlElementType::COMPONENT_REF));
    EXPECT_EQ("b4da57", annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("b4da58", annotator->assignId(itemImportSource));
    EXPECT_EQ("b4da59", annotator->assignId(itemMapVariables));
    EXPECT_EQ("b4da5a", annotator->assignId(itemModel));
    EXPECT_EQ("b4da5b", annotator->assignId(itemReset));
    EXPECT_EQ("b4da5c", annotator->assignId(itemResetValue, libcellml::CellmlElementType::RESET_VALUE));
    EXPECT_EQ("b4da5d", annotator->assignId(itemTestValue, libcellml::CellmlElementType::TEST_VALUE));
    EXPECT_EQ("b4da5e", annotator->assignId(itemUnitsItem));
    EXPECT_EQ("b4da5f", annotator->assignId(itemUnits));
    EXPECT_EQ("b4da60", annotator->assignId(itemVariable));
    EXPECT_EQ("b4da61", annotator->assignId(itemEncapsulation, libcellml::CellmlElementType::ENCAPSULATION));

    EXPECT_EQ("b4da55", model->component(0)->id());
    EXPECT_EQ("b4da56", model->component("component2")->encapsulationId());
    EXPECT_EQ("b4da57", libcellml::Variable::equivalenceConnectionId(connection->variable1(), connection->variable2()));
    EXPECT_EQ("b4da58", model->component("component1")->importSource()->id());
    EXPECT_EQ("b4da59", libcellml::Variable::equivalenceMappingId(mapping->variable1(), mapping->variable2()));
    EXPECT_EQ("b4da5a", model->id());
    EXPECT_EQ("b4da5b", model->component("component2")->reset(0)->id());
    EXPECT_EQ("b4da5c", model->component("component2")->reset(0)->resetValueId());
    EXPECT_EQ("b4da5d", model->component("component2")->reset(0)->testValueId());
    EXPECT_EQ("b4da5e", model->units(1)->unitId(0));
    EXPECT_EQ("b4da5f", model->units(1)->id());
    EXPECT_EQ("b4da60", model->component("component2")->variable(0)->id());
    EXPECT_EQ("b4da61", model->encapsulationId());

    auto connection2 = libcellml::VariablePair::create(
        model->component("component2")->variable("variable1")->equivalentVariable(0),
        model->component("component2")->variable("variable1"));
    auto mapping2 = libcellml::VariablePair::create(
        model->component("component4")->variable("variable2")->equivalentVariable(0),
        model->component("component4")->variable("variable2"));

    auto const &itemConnection2 = connection2;
    auto const &itemMapVariables2 = mapping2;

    EXPECT_EQ("b4da62", annotator->assignId(itemConnection2, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("b4da62", libcellml::Variable::equivalenceConnectionId(connection2->variable1(), connection2->variable2()));

    EXPECT_EQ("b4da63", annotator->assignId(itemMapVariables2));
    EXPECT_EQ("b4da63", libcellml::Variable::equivalenceMappingId(mapping2->variable1(), mapping2->variable2()));
}